

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

size_t kvtree_pack_size(kvtree *hash)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  kvtree_elem_struct *pkVar5;
  
  sVar4 = 4;
  if (hash != (kvtree *)0x0) {
    for (pkVar5 = hash->lh_first; pkVar5 != (kvtree_elem_struct *)0x0;
        pkVar5 = (pkVar5->pointers).le_next) {
      if (pkVar5->key == (char *)0x0) {
        lVar2 = 1;
      }
      else {
        sVar1 = strlen(pkVar5->key);
        lVar2 = sVar1 + 1;
      }
      sVar3 = kvtree_pack_size(pkVar5->hash);
      sVar4 = sVar4 + lVar2 + sVar3;
    }
  }
  return sVar4;
}

Assistant:

size_t kvtree_pack_size(const kvtree* hash)
{
  size_t size = 0;
  if (hash != NULL) {
    kvtree_elem* elem;

    /* add the size required to store the COUNT */
    size += sizeof(uint32_t);

    /* finally add the size of each element */
    LIST_FOREACH(elem, hash, pointers) {
      size += kvtree_elem_pack_size(elem);
    }
  } else {
    size += sizeof(uint32_t);
  }
  return size;
}